

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_15::AreOffsetsAndCoefficientsConstant
               (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *nodes)

{
  SERecurrentNode *this;
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  SENode *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SERecurrentNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *__range2;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *nodes_local;
  
  __end2 = std::
           vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           ::begin(nodes);
  node = (SERecurrentNode *)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::end(nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                                *)&node);
    if (!bVar1) {
      return true;
    }
    ppSVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
              ::operator*(&__end2);
    this = *ppSVar3;
    pSVar4 = SERecurrentNode::GetOffset(this);
    iVar2 = (*pSVar4->_vptr_SENode[4])();
    if (CONCAT44(extraout_var,iVar2) == 0) break;
    pSVar4 = SERecurrentNode::GetOffset(this);
    iVar2 = (*pSVar4->_vptr_SENode[4])();
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SERecurrentNode_*const_*,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
    ::operator++(&__end2);
  }
  return false;
}

Assistant:

bool AreOffsetsAndCoefficientsConstant(
    const std::vector<SERecurrentNode*>& nodes) {
  for (auto node : nodes) {
    if (!node->GetOffset()->AsSEConstantNode() ||
        !node->GetOffset()->AsSEConstantNode()) {
      return false;
    }
  }
  return true;
}